

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag>::
get_best(storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag> *this,
        int *constraints_remaining,double *value,double *duration,long *loop)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  undefined1 local_40 [4];
  int id;
  m_indices_reader lock;
  long *loop_local;
  double *duration_local;
  double *value_local;
  int *constraints_remaining_local;
  storage<baryonyx::itm::default_cost_type<float>,_baryonyx::itm::minimize_tag> *this_local;
  
  lock._8_8_ = loop;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)local_40,&this->m_indices_mutex);
  pvVar2 = std::vector<int,_std::allocator<int>_>::front(&this->m_indices);
  iVar1 = *pvVar2;
  pvVar3 = std::
           vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
           ::operator[](&this->m_data,(long)iVar1);
  *constraints_remaining = pvVar3->remaining_constraints;
  pvVar3 = std::
           vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
           ::operator[](&this->m_data,(long)iVar1);
  *value = pvVar3->value;
  pvVar3 = std::
           vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
           ::operator[](&this->m_data,(long)iVar1);
  *duration = pvVar3->duration;
  pvVar3 = std::
           vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
           ::operator[](&this->m_data,(long)iVar1);
  *(long *)lock._8_8_ = pvVar3->loop;
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_40);
  return;
}

Assistant:

void get_best(int& constraints_remaining,
                  double& value,
                  double& duration,
                  long int& loop) const noexcept
    {
        m_indices_reader lock(m_indices_mutex);
        int id = m_indices.front();

        constraints_remaining = m_data[id].remaining_constraints;
        value = m_data[id].value;
        duration = m_data[id].duration;
        loop = m_data[id].loop;
    }